

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_FEA_loads_statics.cpp
# Opt level: O3

MyLoadCustomMultiple * __thiscall test_1::MyLoadCustomMultiple::Clone(MyLoadCustomMultiple *this)

{
  ChObj *this_00;
  
  this_00 = (ChObj *)operator_new(0x68);
  chrono::ChObj::ChObj(this_00,(ChObj *)this);
  *(undefined8 *)(this_00 + 0x38) = *(undefined8 *)&this->field_0x38;
  *(code **)this_00 = chrono::ChLoadCustomMultiple::LoadGet_field_ncoords;
  std::
  vector<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
  ::vector((vector<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
            *)(this_00 + 0x40),
           (vector<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
            *)&this->field_0x40);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)(this_00 + 0x58),
             (DenseStorage<double,__1,__1,_1,_0> *)&this->field_0x58);
  *(undefined ***)this_00 = &PTR__ChLoadCustomMultiple_00139590;
  return (MyLoadCustomMultiple *)this_00;
}

Assistant:

virtual MyLoadCustomMultiple* Clone() const override { return new MyLoadCustomMultiple(*this); }